

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

ssize_t __thiscall
GGSock::Communicator::send(Communicator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  Data *pDVar2;
  undefined8 extraout_RAX;
  TBufferSize size;
  string msg;
  lock_guard<std::mutex> lock;
  Data *data;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Data *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_1;
  
  pDVar2 = getData((Communicator *)0x12d64b);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if ((pDVar2->isConnected & 1U) == 0) {
    local_1 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0);
    anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
    std::__cxx11::string::reserve((ulong)&stack0xffffffffffffffb0);
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar1 = Data::addMessageToSend(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) {
      local_1 = 0;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if (bVar1) {
      local_1 = 1;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d770);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffffffffffff01;
}

Assistant:

bool Communicator::send(TMessageType type) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutexSend);

        if (data.isConnected == false) return false;

        {
            std::string msg;
            TBufferSize size = ::MessageHeader::getSizeInBytes();

            msg.reserve(size);

            msg.append(reinterpret_cast<const char*>(&size), reinterpret_cast<const char*>(&size)+sizeof(size));
            msg.append(reinterpret_cast<const char*>(&type), reinterpret_cast<const char*>(&type)+sizeof(type));

            if (data.addMessageToSend(std::move(msg)) == false) {
                // error, send buffer is full
                return false;
            }
        }

        return true;
    }